

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O1

void __thiscall IndexIntervalTest_ToInt_Test::TestBody(IndexIntervalTest_ToInt_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  int iVar3;
  int iVar4;
  int idx;
  AssertionResult gtest_ar;
  IndexInterval<pica::Vector3<int>_> interval;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  int local_9c;
  AssertHelper local_98;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  Int3 *local_80;
  Int3 *local_78;
  IndexInterval<pica::Vector3<int>_> local_6c;
  
  local_78 = &(this->super_IndexIntervalTest).end;
  local_80 = &(this->super_IndexIntervalTest).step;
  pica::IndexInterval<pica::Vector3<int>_>::IndexInterval
            (&local_6c,&(this->super_IndexIntervalTest).begin,local_78,local_80);
  local_9c = 0;
  iVar3 = (this->super_IndexIntervalTest).begin.x;
  if (iVar3 < (this->super_IndexIntervalTest).end.x) {
    do {
      for (iVar2 = (this->super_IndexIntervalTest).begin.y;
          iVar2 < (this->super_IndexIntervalTest).end.y;
          iVar2 = iVar2 + (this->super_IndexIntervalTest).step.y) {
        for (iVar4 = (this->super_IndexIntervalTest).begin.z;
            iVar4 < (this->super_IndexIntervalTest).end.z;
            iVar4 = iVar4 + (this->super_IndexIntervalTest).step.z) {
          local_a8.ptr_._0_4_ =
               (((iVar3 - local_6c.shiftedBegin.x) / local_6c.step.x) * local_6c.size.y +
               (iVar2 - local_6c.shiftedBegin.y) / local_6c.step.y) * local_6c.size.z +
               (iVar4 - local_6c.shiftedBegin.z) / local_6c.step.z;
          testing::internal::CmpHelperEQ<int,int>
                    (local_90,"idx","interval.toInt(Int3(i, j, k))",&local_9c,(int *)&local_a8);
          if (local_90[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_a8);
            if (local_88.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = "";
            }
            else {
              message = ((local_88.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                       ,0x9a,message);
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
            testing::internal::AssertHelper::~AssertHelper(&local_98);
            if (local_a8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 (local_a8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_a8.ptr_ + 8))();
              }
              local_a8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_88,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            return;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_9c = local_9c + 1;
        }
      }
      iVar3 = iVar3 + local_80->x;
    } while (iVar3 < local_78->x);
  }
  return;
}

Assistant:

TEST_F(IndexIntervalTest, ToInt)
{
    IndexInterval<Int3> interval(begin, end, step);
    int idx = 0;
    for (int i = begin.x; i < end.x; i += step.x)
    for (int j = begin.y; j < end.y; j += step.y)
    for (int k = begin.z; k < end.z; k += step.z) {
        ASSERT_EQ(idx, interval.toInt(Int3(i, j, k)));
        idx++;
    }
}